

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O1

void __thiscall
llvm::DWARFUnitVector::addUnitsForDWOSection
          (DWARFUnitVector *this,DWARFContext *C,DWARFSection *DWOSection,
          DWARFSectionKind SectionKind,bool Lazy)

{
  DWARFObject *Obj;
  StringRef SS;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  DWARFDebugAbbrev *DA;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t extraout_RDX;
  
  Obj = (C->DObj)._M_t.
        super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
        .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  DA = DWARFContext::getDebugAbbrevDWO(C);
  iVar1 = (*Obj->_vptr_DWARFObject[0x21])(Obj);
  iVar2 = (*Obj->_vptr_DWARFObject[0x1e])(Obj);
  iVar3 = (*Obj->_vptr_DWARFObject[0x1f])(Obj);
  SS.Data._4_4_ = extraout_var_01;
  SS.Data._0_4_ = iVar3;
  iVar3 = (*Obj->_vptr_DWARFObject[0x20])(Obj);
  iVar4 = (*Obj->_vptr_DWARFObject[0x23])(Obj);
  iVar5 = (*Obj->_vptr_DWARFObject[0x1d])(Obj);
  iVar6 = (*((C->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[5])();
  SS.Length = extraout_RDX;
  addUnitsImpl(this,C,Obj,DWOSection,DA,(DWARFSection *)CONCAT44(extraout_var,iVar1),
               (DWARFSection *)CONCAT44(extraout_var_00,iVar2),SS,
               (DWARFSection *)CONCAT44(extraout_var_02,iVar3),
               (DWARFSection *)CONCAT44(extraout_var_03,iVar4),
               (DWARFSection *)CONCAT44(extraout_var_04,iVar5),SUB41(iVar6,0),true,Lazy,SectionKind)
  ;
  return;
}

Assistant:

void DWARFUnitVector::addUnitsForDWOSection(DWARFContext &C,
                                            const DWARFSection &DWOSection,
                                            DWARFSectionKind SectionKind,
                                            bool Lazy) {
  const DWARFObject &D = C.getDWARFObj();
  addUnitsImpl(C, D, DWOSection, C.getDebugAbbrevDWO(), &D.getRangesDWOSection(),
               &D.getLocDWOSection(), D.getStrDWOSection(),
               D.getStrOffsetsDWOSection(), &D.getAddrSection(),
               D.getLineDWOSection(), C.isLittleEndian(), true, Lazy,
               SectionKind);
}